

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::createConstructor
          (Builder *this,Decoration precision,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sources,Id resultTypeId)

{
  uint uVar1;
  uint uVar2;
  Decoration precision_00;
  bool bVar3;
  uint uVar4;
  Id IVar5;
  size_type sVar6;
  const_reference pvVar7;
  uint local_d4;
  undefined1 auStack_d0 [4];
  uint i;
  anon_class_40_5_67b26e2d accumulateMatrixConstituents;
  anon_class_48_6_b78e08d2 accumulateVectorConstituents;
  anon_class_32_4_62b2c330 latchResult;
  undefined1 local_50 [4];
  Id scalarTypeId;
  vector<unsigned_int,_std::allocator<unsigned_int>_> constituents;
  uint targetComponent;
  uint numTargetComponents;
  Id result;
  Id resultTypeId_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *sources_local;
  Builder *pBStack_18;
  Decoration precision_local;
  Builder *this_local;
  
  targetComponent = 0;
  numTargetComponents = resultTypeId;
  _result = sources;
  sources_local._4_4_ = precision;
  pBStack_18 = this;
  constituents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = getNumTypeComponents(this,resultTypeId);
  constituents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(_result);
  if (sVar6 == 1) {
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_result,0);
    bVar3 = isScalar(this,*pvVar7);
    if ((bVar3) &&
       ((1 < constituents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ ||
        (bVar3 = isCooperativeVectorType(this,numTargetComponents), bVar3)))) {
      precision_00 = sources_local._4_4_;
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_result,0);
      IVar5 = smearScalar(this,precision_00,*pvVar7,numTargetComponents);
      return IVar5;
    }
  }
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(_result);
  if (sVar6 == 1) {
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_result,0);
    bVar3 = isVector(this,*pvVar7);
    uVar1 = constituents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
    if (bVar3) {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_result,0);
      uVar4 = getNumComponents(this,*pvVar7);
      uVar2 = numTargetComponents;
      if (uVar1 == uVar4) {
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_result,0);
        IVar5 = getTypeId(this,*pvVar7);
        if (uVar2 == IVar5) {
          pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](_result,0);
          return *pvVar7;
        }
        __assert_fail("resultTypeId == getTypeId(sources[0])",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                      ,0xde3,
                      "Id spv::Builder::createConstructor(Decoration, const std::vector<Id> &, Id)")
        ;
      }
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  latchResult.targetComponent._4_4_ = getScalarTypeId(this,numTargetComponents);
  accumulateVectorConstituents.scalarTypeId =
       (Id *)((long)&constituents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  latchResult.numTargetComponents = (uint *)local_50;
  latchResult.constituents = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&targetComponent
  ;
  latchResult.result =
       (Id *)&constituents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  accumulateVectorConstituents.this =
       (Builder *)
       &constituents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  accumulateVectorConstituents.targetComponent =
       (uint *)((long)&constituents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  accumulateVectorConstituents.numTargetComponents =
       (uint *)&accumulateVectorConstituents.scalarTypeId;
  accumulateVectorConstituents.latchResult = (anon_class_32_4_62b2c330 *)((long)&sources_local + 4);
  accumulateVectorConstituents.precision = (Decoration *)((long)&latchResult.targetComponent + 4);
  accumulateMatrixConstituents.this =
       (Builder *)
       &constituents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  accumulateMatrixConstituents.targetComponent =
       (uint *)((long)&constituents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  accumulateMatrixConstituents.numTargetComponents =
       (uint *)&accumulateVectorConstituents.scalarTypeId;
  accumulateMatrixConstituents.latchResult =
       (anon_class_32_4_62b2c330 *)((long)&latchResult.targetComponent + 4);
  _auStack_d0 = this;
  accumulateMatrixConstituents.scalarTypeId = (Id *)this;
  for (local_d4 = 0; sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(_result)
      , local_d4 < sVar6; local_d4 = local_d4 + 1) {
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (_result,(ulong)local_d4);
    bVar3 = isScalar(this,*pvVar7);
    if (bVar3) {
LAB_006de5e6:
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (_result,(ulong)local_d4);
      createConstructor::anon_class_32_4_62b2c330::operator()
                ((anon_class_32_4_62b2c330 *)&accumulateVectorConstituents.scalarTypeId,*pvVar7);
    }
    else {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (_result,(ulong)local_d4);
      bVar3 = isPointer(this,*pvVar7);
      if (bVar3) goto LAB_006de5e6;
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (_result,(ulong)local_d4);
      bVar3 = isVector(this,*pvVar7);
      if (bVar3) {
LAB_006de64f:
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (_result,(ulong)local_d4);
        createConstructor::anon_class_48_6_b78e08d2::operator()
                  ((anon_class_48_6_b78e08d2 *)&accumulateMatrixConstituents.scalarTypeId,*pvVar7);
      }
      else {
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (_result,(ulong)local_d4);
        bVar3 = isCooperativeVector(this,*pvVar7);
        if (bVar3) goto LAB_006de64f;
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (_result,(ulong)local_d4);
        bVar3 = isMatrix(this,*pvVar7);
        if (!bVar3) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                        ,0xe23,
                        "Id spv::Builder::createConstructor(Decoration, const std::vector<Id> &, Id)"
                       );
        }
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (_result,(ulong)local_d4);
        createConstructor::anon_class_40_5_67b26e2d::operator()
                  ((anon_class_40_5_67b26e2d *)auStack_d0,*pvVar7);
      }
    }
    if (constituents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ <=
        (uint)constituents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) break;
  }
  sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  if (sVar6 == 0) {
    this_local._4_4_ = targetComponent;
  }
  else {
    targetComponent =
         createCompositeConstruct
                   (this,numTargetComponents,
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
    this_local._4_4_ = setPrecision(this,targetComponent,sources_local._4_4_);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  return this_local._4_4_;
}

Assistant:

Id Builder::createConstructor(Decoration precision, const std::vector<Id>& sources, Id resultTypeId)
{
    Id result = NoResult;
    unsigned int numTargetComponents = getNumTypeComponents(resultTypeId);
    unsigned int targetComponent = 0;

    // Special case: when calling a vector constructor with a single scalar
    // argument, smear the scalar
    if (sources.size() == 1 && isScalar(sources[0]) && (numTargetComponents > 1 || isCooperativeVectorType(resultTypeId)))
        return smearScalar(precision, sources[0], resultTypeId);

    // Special case: 2 vectors of equal size
    if (sources.size() == 1 && isVector(sources[0]) && numTargetComponents == getNumComponents(sources[0])) {
        assert(resultTypeId == getTypeId(sources[0]));
        return sources[0];
    }

    // accumulate the arguments for OpCompositeConstruct
    std::vector<Id> constituents;
    Id scalarTypeId = getScalarTypeId(resultTypeId);

    // lambda to store the result of visiting an argument component
    const auto latchResult = [&](Id comp) {
        if (numTargetComponents > 1)
            constituents.push_back(comp);
        else
            result = comp;
        ++targetComponent;
    };

    // lambda to visit a vector argument's components
    const auto accumulateVectorConstituents = [&](Id sourceArg) {
        unsigned int sourceSize = getNumComponents(sourceArg);
        unsigned int sourcesToUse = sourceSize;
        if (sourcesToUse + targetComponent > numTargetComponents)
            sourcesToUse = numTargetComponents - targetComponent;

        for (unsigned int s = 0; s < sourcesToUse; ++s) {
            std::vector<unsigned> swiz;
            swiz.push_back(s);
            latchResult(createRvalueSwizzle(precision, scalarTypeId, sourceArg, swiz));
        }
    };

    // lambda to visit a matrix argument's components
    const auto accumulateMatrixConstituents = [&](Id sourceArg) {
        unsigned int sourceSize = getNumColumns(sourceArg) * getNumRows(sourceArg);
        unsigned int sourcesToUse = sourceSize;
        if (sourcesToUse + targetComponent > numTargetComponents)
            sourcesToUse = numTargetComponents - targetComponent;

        unsigned int col = 0;
        unsigned int row = 0;
        for (unsigned int s = 0; s < sourcesToUse; ++s) {
            if (row >= getNumRows(sourceArg)) {
                row = 0;
                col++;
            }
            std::vector<Id> indexes;
            indexes.push_back(col);
            indexes.push_back(row);
            latchResult(createCompositeExtract(sourceArg, scalarTypeId, indexes));
            row++;
        }
    };

    // Go through the source arguments, each one could have either
    // a single or multiple components to contribute.
    for (unsigned int i = 0; i < sources.size(); ++i) {

        if (isScalar(sources[i]) || isPointer(sources[i]))
            latchResult(sources[i]);
        else if (isVector(sources[i]) || isCooperativeVector(sources[i]))
            accumulateVectorConstituents(sources[i]);
        else if (isMatrix(sources[i]))
            accumulateMatrixConstituents(sources[i]);
        else
            assert(0);

        if (targetComponent >= numTargetComponents)
            break;
    }

    // If the result is a vector, make it from the gathered constituents.
    if (constituents.size() > 0) {
        result = createCompositeConstruct(resultTypeId, constituents);
        return setPrecision(result, precision);
    } else {
      // Precision was set when generating this component.
      return result;
    }
}